

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O0

int key_schedule(ptls_hpke_kem_t *kem,ptls_hpke_cipher_suite_t *cipher,ptls_aead_context_t **ctx,
                int is_enc,void *shared_secret,ptls_iovec_t info)

{
  size_t sVar1;
  uint8_t *puVar2;
  ptls_aead_context_t *ppVar3;
  ptls_iovec_t pVar4;
  ptls_iovec_t pVar5;
  undefined1 local_15d;
  int local_15c;
  undefined1 local_158 [4];
  int ret;
  uint8_t base_nonce [32];
  uint8_t key [32];
  uint8_t secret [64];
  uint8_t key_schedule_context_smallbuf [128];
  undefined1 local_50 [8];
  ptls_buffer_t key_schedule_context;
  void *shared_secret_local;
  int is_enc_local;
  ptls_aead_context_t **ctx_local;
  ptls_hpke_cipher_suite_t *cipher_local;
  ptls_hpke_kem_t *kem_local;
  
  *ctx = (ptls_aead_context_t *)0x0;
  key_schedule_context._24_8_ = shared_secret;
  ptls_buffer_init((ptls_buffer_t *)local_50,secret + 0x38,0x80);
  local_15d = 0;
  local_15c = ptls_buffer__do_pushv((ptls_buffer_t *)local_50,&local_15d,1);
  if ((local_15c == 0) &&
     (local_15c = ptls_buffer_reserve((ptls_buffer_t *)local_50,cipher->hash->digest_size),
     local_15c == 0)) {
    puVar2 = (uint8_t *)((long)local_50 + key_schedule_context.capacity);
    pVar4 = ptls_iovec_init((void *)0x0,0);
    pVar5 = ptls_iovec_init((void *)0x0,0);
    local_15c = labeled_extract(kem,cipher,puVar2,pVar4,"psk_id_hash",pVar5);
    if (local_15c == 0) {
      key_schedule_context.capacity = cipher->hash->digest_size + key_schedule_context.capacity;
      local_15c = ptls_buffer_reserve((ptls_buffer_t *)local_50,cipher->hash->digest_size);
      if (local_15c == 0) {
        puVar2 = (uint8_t *)((long)local_50 + key_schedule_context.capacity);
        pVar4 = ptls_iovec_init((void *)0x0,0);
        local_15c = labeled_extract(kem,cipher,puVar2,pVar4,"info_hash",info);
        if (local_15c == 0) {
          key_schedule_context.capacity = cipher->hash->digest_size + key_schedule_context.capacity;
          pVar4 = ptls_iovec_init((void *)key_schedule_context._24_8_,kem->hash->digest_size);
          pVar5 = ptls_iovec_init("",0);
          local_15c = labeled_extract(kem,cipher,key + 0x18,pVar4,"secret",pVar5);
          if (local_15c == 0) {
            sVar1 = cipher->aead->key_size;
            pVar4 = ptls_iovec_init(key + 0x18,cipher->hash->digest_size);
            pVar5 = ptls_iovec_init((void *)local_50,key_schedule_context.capacity);
            local_15c = labeled_expand(kem,cipher,base_nonce + 0x18,sVar1,pVar4,"key",pVar5);
            if (local_15c == 0) {
              sVar1 = cipher->aead->iv_size;
              pVar4 = ptls_iovec_init(key + 0x18,cipher->hash->digest_size);
              pVar5 = ptls_iovec_init((void *)local_50,key_schedule_context.capacity);
              local_15c = labeled_expand(kem,cipher,local_158,sVar1,pVar4,"base_nonce",pVar5);
              if (local_15c == 0) {
                ppVar3 = ptls_aead_new_direct(cipher->aead,is_enc,base_nonce + 0x18,local_158);
                *ctx = ppVar3;
              }
            }
          }
        }
      }
    }
  }
  ptls_buffer_dispose((ptls_buffer_t *)local_50);
  (*ptls_clear_memory)(key + 0x18,0x40);
  (*ptls_clear_memory)(base_nonce + 0x18,0x20);
  (*ptls_clear_memory)(local_158,0x20);
  return local_15c;
}

Assistant:

static int key_schedule(ptls_hpke_kem_t *kem, ptls_hpke_cipher_suite_t *cipher, ptls_aead_context_t **ctx, int is_enc,
                        const void *shared_secret, ptls_iovec_t info)
{
    ptls_buffer_t key_schedule_context;
    uint8_t key_schedule_context_smallbuf[128], secret[PTLS_MAX_DIGEST_SIZE], key[PTLS_MAX_SECRET_SIZE],
        base_nonce[PTLS_MAX_IV_SIZE];
    int ret;

    *ctx = NULL;

    ptls_buffer_init(&key_schedule_context, key_schedule_context_smallbuf, sizeof(key_schedule_context_smallbuf));

    /* key_schedule_context = concat(mode, LabeledExtract("", "psk_id_hash", psk_id), LabeledExtract("", "info_hash", info)) */
    ptls_buffer_push(&key_schedule_context, PTLS_HPKE_MODE_BASE);
    if ((ret = ptls_buffer_reserve(&key_schedule_context, cipher->hash->digest_size)) != 0 ||
        (ret = labeled_extract(kem, cipher, key_schedule_context.base + key_schedule_context.off, ptls_iovec_init(NULL, 0),
                               "psk_id_hash", ptls_iovec_init(NULL, 0))) != 0)
        goto Exit;
    key_schedule_context.off += cipher->hash->digest_size;
    if ((ret = ptls_buffer_reserve(&key_schedule_context, cipher->hash->digest_size)) != 0 ||
        (ret = labeled_extract(kem, cipher, key_schedule_context.base + key_schedule_context.off, ptls_iovec_init(NULL, 0),
                               "info_hash", info)) != 0)
        goto Exit;
    key_schedule_context.off += cipher->hash->digest_size;

    /* secret = LabeledExtract(shared_secret, "secret", psk) */
    if ((ret = labeled_extract(kem, cipher, secret, ptls_iovec_init(shared_secret, kem->hash->digest_size), "secret",
                               ptls_iovec_init("", 0))) != 0)
        goto Exit;

    /* key, base_nonce */
    if ((ret = labeled_expand(kem, cipher, key, cipher->aead->key_size, ptls_iovec_init(secret, cipher->hash->digest_size), "key",
                              ptls_iovec_init(key_schedule_context.base, key_schedule_context.off))) != 0)
        goto Exit;
    if ((ret = labeled_expand(kem, cipher, base_nonce, cipher->aead->iv_size, ptls_iovec_init(secret, cipher->hash->digest_size),
                              "base_nonce", ptls_iovec_init(key_schedule_context.base, key_schedule_context.off))) != 0)
        goto Exit;

    *ctx = ptls_aead_new_direct(cipher->aead, is_enc, key, base_nonce);

Exit:
    ptls_buffer_dispose(&key_schedule_context);
    ptls_clear_memory(secret, sizeof(secret));
    ptls_clear_memory(key, sizeof(key));
    ptls_clear_memory(base_nonce, sizeof(base_nonce));
    return ret;
}